

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

wpt_object wpt_init(wave_object wave,int siglength,int J)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  wpt_object pwVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  double dVar9;
  
  if (100 < J) {
    puts("\n The Decomposition Iterations Cannot Exceed 100. Exiting ");
LAB_00102c89:
    exit(-1);
  }
  iVar1 = wave->filtlength;
  uVar2 = wmaxiter(siglength);
  if ((int)uVar2 < J) {
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar2);
    goto LAB_00102c89;
  }
  if (J < 1) {
    iVar6 = 0;
  }
  else {
    iVar8 = 1;
    iVar6 = 0;
    iVar3 = J;
    do {
      iVar6 = iVar6 + iVar8 * 2;
      iVar8 = iVar8 * 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    if (0 < J) {
      uVar7 = J + 1;
      iVar3 = siglength;
      iVar4 = 2;
      do {
        iVar8 = iVar4;
        dVar9 = ceil((double)(iVar3 + iVar1 + -2) * 0.5);
        iVar3 = (int)dVar9;
        uVar7 = uVar7 - 1;
        iVar4 = iVar8 * 2;
      } while (1 < uVar7);
      iVar8 = iVar8 * iVar3;
      goto LAB_00102b32;
    }
  }
  iVar8 = 0;
LAB_00102b32:
  iVar3 = iVar8 + iVar6 * 4;
  iVar4 = iVar3 + J * 2 + 6;
  pwVar5 = (wpt_object)malloc((long)iVar4 * 8 + 0x220);
  pwVar5->outlength = (iVar1 + 1) * (J * 2 + 2) + siglength;
  builtin_strncpy(pwVar5->ext,"sym",4);
  builtin_strncpy(pwVar5->entropy,"shannon",8);
  pwVar5->eparam = 0.0;
  pwVar5->wave = wave;
  pwVar5->siglength = siglength;
  pwVar5->J = J;
  pwVar5->MaxIter = uVar2;
  pwVar5->even = ~siglength & 1;
  pwVar5->cobj = (conv_object)0x0;
  pwVar5->nodes = iVar6;
  pwVar5->lenlength = J + 2;
  pwVar5->output = (double *)(pwVar5 + 1);
  pwVar5->costvalues = (double *)(pwVar5[1].ext + (long)iVar8 * 8 + -0x28);
  pwVar5->basisvector = (double *)(pwVar5[1].ext + (long)(iVar6 + 1 + iVar8) * 8 + -0x28);
  pwVar5->nodeindex = (int *)(pwVar5[1].ext + (long)(iVar8 + 2 + iVar6 * 2) * 8 + -0x28);
  pwVar5->numnodeslevel = (int *)(pwVar5[1].ext + (long)iVar3 * 8 + -8);
  pwVar5->coeflength = (int *)(pwVar5[1].ext + (long)(J + 5 + iVar3) * 8 + -0x28);
  if (0 < iVar4) {
    memset(pwVar5 + 1,0,(ulong)(iVar3 + J * 2 + 5) * 8 + 8);
  }
  return pwVar5;
}

Assistant:

wpt_object wpt_init(wave_object wave, int siglength, int J) {
	int size, i, MaxIter, temp, nodes,elength,p2,N,lp;
	wpt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	nodes = 0;
	for (i = 0; i < J; ++i) {
		temp *= 2;
		nodes += temp;
	}

	i = J;
	p2 = 2;
	N = siglength;
	lp = size;
	elength = 0;
	while (i > 0) {
		N = N + lp - 2;
		N = (int)ceil((double)N / 2.0);
		elength = p2 * N;
		i--;
		p2 *= 2;
	}
	//printf("elength %d", elength);

	obj = (wpt_object)malloc(sizeof(struct wpt_set) + sizeof(double)* (elength + 4 * nodes + 2 * J + 6));
	obj->outlength = siglength + 2 * (J + 1) * (size + 1);
	strcpy(obj->ext, "sym");
	strcpy(obj->entropy, "shannon");
	obj->eparam = 0.0;

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->costvalues = &obj->params[elength];
	obj->basisvector = &obj->params[elength + nodes + 1];
	obj->nodeindex = (int*)&obj->params[elength + 2*nodes + 2];
	obj->numnodeslevel = (int*)&obj->params[elength + 4 * nodes + 4];
	obj->coeflength = (int*)&obj->params[elength + 4 * nodes + J + 5];

	for (i = 0; i < elength + 4 * nodes + 2 * J + 6; ++i) {
		obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}